

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

StringOrCallback * __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<std::function<void()>&,void>
          (variant<std::__cxx11::string,std::function<bool()>> *__return_storage_ptr__,
          ValueImpl<true> *this,function<void_()> *cb)

{
  anon_class_40_2_a93b23f4 local_70;
  function<bool_()> local_48;
  function<void_()> *local_28;
  function<void_()> *cb_local;
  ValueImpl<true> *this_local;
  variant<std::__cxx11::string,std::function<bool()>> *local_10;
  
  local_28 = cb;
  cb_local = (function<void_()> *)this;
  local_10 = __return_storage_ptr__;
  std::function<void_()>::function(&local_70.cb,cb);
  local_70.is_called = false;
  std::function<bool()>::
  function<google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<std::function<void()>&,void>(std::function<void()>&,google::protobuf::io::Printer::ValueImpl<true>::Rank2)::_lambda()_1_,void>
            ((function<bool()> *)&local_48,&local_70);
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (__return_storage_ptr__,&local_48);
  std::function<bool_()>::~function(&local_48);
  ToStringOrCallback<std::function<void()>&,void>(std::function<void()>&,google::protobuf::io::Printer::ValueImpl<true>::Rank2)
  ::{lambda()#1}::~Rank2((_lambda___1_ *)&local_70);
  return (StringOrCallback *)__return_storage_ptr__;
}

Assistant:

auto Printer::ValueImpl<owned>::ToStringOrCallback(Cb&& cb, Rank2)
    -> StringOrCallback {
  return Callback(
      [cb = std::forward<Cb>(cb), is_called = false]() mutable -> bool {
        if (is_called) {
          // Catch whether or not this function is being called recursively.
          return false;
        }
        is_called = true;
        cb();
        is_called = false;
        return true;
      });
}